

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceHPoint.cpp
# Opt level: O3

HPoint * __thiscall IceMaths::HPoint::operator*=(HPoint *this,Matrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = (this->super_Point).x;
  fVar2 = (this->super_Point).y;
  fVar3 = (this->super_Point).z;
  fVar4 = this->w;
  fVar5 = mat->m[0][1];
  fVar6 = mat->m[0][2];
  fVar7 = mat->m[0][3];
  fVar8 = mat->m[1][1];
  fVar9 = mat->m[1][2];
  fVar10 = mat->m[1][3];
  fVar11 = mat->m[2][1];
  fVar12 = mat->m[2][2];
  fVar13 = mat->m[2][3];
  fVar14 = mat->m[3][1];
  fVar15 = mat->m[3][2];
  fVar16 = mat->m[3][3];
  (this->super_Point).x =
       fVar4 * mat->m[3][0] + fVar3 * mat->m[2][0] + fVar1 * mat->m[0][0] + mat->m[1][0] * fVar2;
  (this->super_Point).y = fVar4 * fVar14 + fVar3 * fVar11 + fVar1 * fVar5 + fVar8 * fVar2;
  (this->super_Point).z = fVar4 * fVar15 + fVar3 * fVar12 + fVar1 * fVar6 + fVar9 * fVar2;
  this->w = fVar4 * fVar16 + fVar3 * fVar13 + fVar1 * fVar7 + fVar10 * fVar2;
  return this;
}

Assistant:

HPoint& HPoint::operator*=(const Matrix4x4& mat)
{
	float xp = x * mat.m[0][0] + y * mat.m[1][0] + z * mat.m[2][0] + w * mat.m[3][0];
	float yp = x * mat.m[0][1] + y * mat.m[1][1] + z * mat.m[2][1] + w * mat.m[3][1];
	float zp = x * mat.m[0][2] + y * mat.m[1][2] + z * mat.m[2][2] + w * mat.m[3][2];
	float wp = x * mat.m[0][3] + y * mat.m[1][3] + z * mat.m[2][3] + w * mat.m[3][3];

	x = xp; y = yp; z = zp; w = wp;

	return	*this;
}